

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashing.h
# Opt level: O0

hash_state *
llvm::hashing::detail::hash_state::create(hash_state *__return_storage_ptr__,char *s,uint64_t seed)

{
  uint64_t uVar1;
  hash_state *state;
  uint64_t seed_local;
  char *s_local;
  
  __return_storage_ptr__->h0 = 0;
  __return_storage_ptr__->h1 = seed;
  uVar1 = hash_16_bytes(seed,0xb492b66fbe98f273);
  __return_storage_ptr__->h2 = uVar1;
  uVar1 = rotate(seed ^ 0xb492b66fbe98f273,0x31);
  __return_storage_ptr__->h3 = uVar1;
  __return_storage_ptr__->h4 = seed * -0x4b6d499041670d8d;
  uVar1 = shift_mix(seed);
  __return_storage_ptr__->h5 = uVar1;
  __return_storage_ptr__->h6 = 0;
  uVar1 = hash_16_bytes(__return_storage_ptr__->h4,__return_storage_ptr__->h5);
  __return_storage_ptr__->h6 = uVar1;
  mix(__return_storage_ptr__,s);
  return __return_storage_ptr__;
}

Assistant:

static hash_state create(const char *s, uint64_t seed) {
    hash_state state = {
      0, seed, hash_16_bytes(seed, k1), rotate(seed ^ k1, 49),
      seed * k1, shift_mix(seed), 0 };
    state.h6 = hash_16_bytes(state.h4, state.h5);
    state.mix(s);
    return state;
  }